

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O2

bool __thiscall cmGetPropertyCommand::HandleInstallMode(cmGetPropertyCommand *this)

{
  bool bVar1;
  cmake *this_00;
  cmInstalledFile *this_01;
  ostream *poVar2;
  _Alloc_hider value;
  ostringstream e;
  string local_1b0;
  string local_190 [11];
  
  if ((this->Name)._M_string_length == 0) {
    std::__cxx11::string::string
              ((string *)local_190,"not given name for INSTALL scope.",(allocator *)&local_1b0);
    cmCommand::SetError(&this->super_cmCommand,local_190);
    std::__cxx11::string::~string((string *)local_190);
  }
  else {
    this_00 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    this_01 = cmake::GetOrCreateInstalledFile(this_00,(this->super_cmCommand).Makefile,&this->Name);
    if (this_01 != (cmInstalledFile *)0x0) {
      local_190[0]._M_dataplus._M_p = (pointer)&local_190[0].field_2;
      local_190[0]._M_string_length = 0;
      local_190[0].field_2._M_local_buf[0] = '\0';
      bVar1 = cmInstalledFile::GetProperty(this_01,&this->PropertyName,local_190);
      value._M_p = local_190[0]._M_dataplus._M_p;
      if (!bVar1) {
        value._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x0;
      }
      StoreResult(this,value._M_p);
      std::__cxx11::string::~string((string *)local_190);
      return true;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    poVar2 = std::operator<<((ostream *)local_190,
                             "given INSTALL name that could not be found or created: ");
    std::operator<<(poVar2,(string *)&this->Name);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  }
  return false;
}

Assistant:

bool cmGetPropertyCommand::HandleInstallMode()
{
  if (this->Name.empty()) {
    this->SetError("not given name for INSTALL scope.");
    return false;
  }

  // Get the installed file.
  cmake* cm = this->Makefile->GetCMakeInstance();

  if (cmInstalledFile* file =
        cm->GetOrCreateInstalledFile(this->Makefile, this->Name)) {
    std::string value;
    bool isSet = file->GetProperty(this->PropertyName, value);

    return this->StoreResult(isSet ? value.c_str() : CM_NULLPTR);
  }
  std::ostringstream e;
  e << "given INSTALL name that could not be found or created: " << this->Name;
  this->SetError(e.str());
  return false;
}